

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O2

Matrix4x4 * CMU462::outer(Vector4D *u,Vector4D *v)

{
  double dVar1;
  double *pdVar2;
  long lVar3;
  Matrix4x4 *B;
  double *in_RDI;
  long lVar4;
  
  pdVar2 = in_RDI;
  in_RDI[0xe] = 0.0;
  in_RDI[0xf] = 0.0;
  in_RDI[0xc] = 0.0;
  in_RDI[0xd] = 0.0;
  in_RDI[10] = 0.0;
  in_RDI[0xb] = 0.0;
  in_RDI[8] = 0.0;
  in_RDI[9] = 0.0;
  in_RDI[6] = 0.0;
  in_RDI[7] = 0.0;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  *in_RDI = 0.0;
  in_RDI[1] = 0.0;
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    dVar1 = (&u->x)[lVar3];
    for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 8) {
      *(double *)((long)in_RDI + lVar4 * 4) = *(double *)((long)&v->x + lVar4) * dVar1;
    }
    in_RDI = in_RDI + 1;
  }
  return (Matrix4x4 *)pdVar2;
}

Assistant:

Matrix4x4 outer( const Vector4D& u, const Vector4D& v ) {
    Matrix4x4 B;

    // Opposite of an inner product.
    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
       B( i, j ) = u[i]*v[j];
    }

    return B;
  }